

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_loadDEntropy(ZSTD_entropyDTables_t *entropy,void *dict,size_t dictSize)

{
  U32 UVar1;
  uint uVar2;
  size_t code;
  size_t code_00;
  void *pvVar3;
  size_t code_01;
  short *normalizedCounter;
  ulong uVar4;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  U32 rep;
  size_t dictContentSize;
  int i;
  size_t litlengthHeaderSize;
  uint litlengthLog;
  uint litlengthMaxValue;
  short litlengthNCount [36];
  size_t matchlengthHeaderSize;
  uint matchlengthLog;
  uint matchlengthMaxValue;
  short matchlengthNCount [53];
  size_t offcodeHeaderSize;
  uint offcodeLog;
  uint offcodeMaxValue;
  short offcodeNCount [32];
  size_t hSize;
  size_t workspaceSize;
  void *workspace;
  BYTE *dictEnd;
  BYTE *dictPtr;
  void *in_stack_fffffffffffffe58;
  uint *in_stack_fffffffffffffe60;
  uint *puVar5;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar6;
  uint in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  U32 *in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe84;
  int iVar7;
  short *in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  void *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  uint local_110;
  int in_stack_fffffffffffffef4;
  uint uVar8;
  size_t in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  void *in_stack_ffffffffffffff10;
  HUF_DTable *in_stack_ffffffffffffff18;
  uint local_90;
  long local_28;
  size_t local_8;
  
  if (in_RDX < 9) {
    local_8 = 0xffffffffffffffe2;
  }
  else {
    UVar1 = MEM_readLE32(in_stack_fffffffffffffe58);
    if (UVar1 != 0xec30a437) {
      __assert_fail("MEM_readLE32(dict) == ZSTD_MAGIC_DICTIONARY",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa0e3,
                    "size_t ZSTD_loadDEntropy(ZSTD_entropyDTables_t *, const void *const, const size_t)"
                   );
    }
    code = HUF_readDTableX2_wksp
                     (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                      in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4)
    ;
    uVar2 = ERR_isError(code);
    if (uVar2 == 0) {
      code_00 = FSE_readNCount((short *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),
                               (uint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                               ,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,0x2f5fee);
      uVar2 = ERR_isError(code_00);
      if (uVar2 == 0) {
        if (local_90 < 9) {
          pvVar3 = (void *)(in_RDI + 0x6828);
          puVar5 = (uint *)0x274;
          uVar6 = 0;
          ZSTD_buildFSETable((ZSTD_seqSymbol *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                             in_stack_fffffffffffffe78,
                             (U8 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             in_stack_fffffffffffffe6c,in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
          uVar8 = 0x34;
          code_01 = FSE_readNCount((short *)CONCAT44(in_stack_fffffffffffffe74,
                                                     in_stack_fffffffffffffe70),
                                   (uint *)CONCAT44(in_stack_fffffffffffffe6c,uVar6),puVar5,pvVar3,
                                   0x2f6109);
          uVar2 = ERR_isError(code_01);
          if (uVar2 == 0) {
            if (uVar8 < 0x35) {
              if (local_110 < 10) {
                pvVar3 = (void *)(in_RDI + 0x6828);
                puVar5 = (uint *)0x274;
                uVar6 = 0;
                ZSTD_buildFSETable((ZSTD_seqSymbol *)
                                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                   in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                                   in_stack_fffffffffffffe78,
                                   (U8 *)CONCAT44(in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70),
                                   in_stack_fffffffffffffe6c,in_stack_fffffffffffffea0,
                                   in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
                uVar8 = 0x23;
                normalizedCounter =
                     (short *)FSE_readNCount((short *)CONCAT44(in_stack_fffffffffffffe74,
                                                               in_stack_fffffffffffffe70),
                                             (uint *)CONCAT44(in_stack_fffffffffffffe6c,uVar6),
                                             puVar5,pvVar3,0x2f6218);
                uVar2 = ERR_isError((size_t)normalizedCounter);
                if (uVar2 == 0) {
                  if (uVar8 < 0x24) {
                    if (in_stack_fffffffffffffe90 < 10) {
                      pvVar3 = (void *)(in_RDI + 0x6828);
                      ZSTD_buildFSETable((ZSTD_seqSymbol *)CONCAT44(uVar8,in_stack_fffffffffffffe90)
                                         ,normalizedCounter,in_stack_fffffffffffffe84,
                                         in_stack_fffffffffffffe78,
                                         (U8 *)CONCAT44(in_stack_fffffffffffffe74,
                                                        in_stack_fffffffffffffe70),
                                         in_stack_fffffffffffffe6c,in_stack_fffffffffffffea0,
                                         in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
                      local_28 = (long)normalizedCounter + code_01 + code_00 + code + in_RSI + 8;
                      if (in_RSI + in_RDX < local_28 + 0xcU) {
                        local_8 = 0xffffffffffffffe2;
                      }
                      else {
                        uVar4 = (in_RSI + in_RDX) - (local_28 + 0xc);
                        for (iVar7 = 0; iVar7 < 3; iVar7 = iVar7 + 1) {
                          UVar1 = MEM_readLE32(pvVar3);
                          local_28 = local_28 + 4;
                          if ((UVar1 == 0) || (uVar4 < UVar1)) {
                            return 0xffffffffffffffe2;
                          }
                          *(U32 *)(in_RDI + 0x681c + (long)iVar7 * 4) = UVar1;
                        }
                        local_8 = local_28 - in_RSI;
                      }
                    }
                    else {
                      local_8 = 0xffffffffffffffe2;
                    }
                  }
                  else {
                    local_8 = 0xffffffffffffffe2;
                  }
                }
                else {
                  local_8 = 0xffffffffffffffe2;
                }
              }
              else {
                local_8 = 0xffffffffffffffe2;
              }
            }
            else {
              local_8 = 0xffffffffffffffe2;
            }
          }
          else {
            local_8 = 0xffffffffffffffe2;
          }
        }
        else {
          local_8 = 0xffffffffffffffe2;
        }
      }
      else {
        local_8 = 0xffffffffffffffe2;
      }
    }
    else {
      local_8 = 0xffffffffffffffe2;
    }
  }
  return local_8;
}

Assistant:

size_t
ZSTD_loadDEntropy(ZSTD_entropyDTables_t* entropy,
                  const void* const dict, size_t const dictSize)
{
    const BYTE* dictPtr = (const BYTE*)dict;
    const BYTE* const dictEnd = dictPtr + dictSize;

    RETURN_ERROR_IF(dictSize <= 8, dictionary_corrupted, "dict is too small");
    assert(MEM_readLE32(dict) == ZSTD_MAGIC_DICTIONARY);   /* dict must be valid */
    dictPtr += 8;   /* skip header = magic + dictID */

    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, OFTable) == offsetof(ZSTD_entropyDTables_t, LLTable) + sizeof(entropy->LLTable));
    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, MLTable) == offsetof(ZSTD_entropyDTables_t, OFTable) + sizeof(entropy->OFTable));
    ZSTD_STATIC_ASSERT(sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable) >= HUF_DECOMPRESS_WORKSPACE_SIZE);
    {   void* const workspace = &entropy->LLTable;   /* use fse tables as temporary workspace; implies fse tables are grouped together */
        size_t const workspaceSize = sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable);
#ifdef HUF_FORCE_DECOMPRESS_X1
        /* in minimal huffman, we always use X1 variants */
        size_t const hSize = HUF_readDTableX1_wksp(entropy->hufTable,
                                                dictPtr, dictEnd - dictPtr,
                                                workspace, workspaceSize, /* flags */ 0);
#else
        size_t const hSize = HUF_readDTableX2_wksp(entropy->hufTable,
                                                dictPtr, (size_t)(dictEnd - dictPtr),
                                                workspace, workspaceSize, /* flags */ 0);
#endif
        RETURN_ERROR_IF(HUF_isError(hSize), dictionary_corrupted, "");
        dictPtr += hSize;
    }

    {   short offcodeNCount[MaxOff+1];
        unsigned offcodeMaxValue = MaxOff, offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, (size_t)(dictEnd-dictPtr));
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeMaxValue > MaxOff, dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted, "");
        ZSTD_buildFSETable( entropy->OFTable,
                            offcodeNCount, offcodeMaxValue,
                            OF_base, OF_bits,
                            offcodeLog,
                            entropy->workspace, sizeof(entropy->workspace),
                            /* bmi2 */0);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, (size_t)(dictEnd-dictPtr));
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthMaxValue > MaxML, dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted, "");
        ZSTD_buildFSETable( entropy->MLTable,
                            matchlengthNCount, matchlengthMaxValue,
                            ML_base, ML_bits,
                            matchlengthLog,
                            entropy->workspace, sizeof(entropy->workspace),
                            /* bmi2 */ 0);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, (size_t)(dictEnd-dictPtr));
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthMaxValue > MaxLL, dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted, "");
        ZSTD_buildFSETable( entropy->LLTable,
                            litlengthNCount, litlengthMaxValue,
                            LL_base, LL_bits,
                            litlengthLog,
                            entropy->workspace, sizeof(entropy->workspace),
                            /* bmi2 */ 0);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted, "");
    {   int i;
        size_t const dictContentSize = (size_t)(dictEnd - (dictPtr+12));
        for (i=0; i<3; i++) {
            U32 const rep = MEM_readLE32(dictPtr); dictPtr += 4;
            RETURN_ERROR_IF(rep==0 || rep > dictContentSize,
                            dictionary_corrupted, "");
            entropy->rep[i] = rep;
    }   }

    return (size_t)(dictPtr - (const BYTE*)dict);
}